

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData *
deqp::gles3::Performance::anon_unknown_0::Utils::variableQuad
          (ObjectData *__return_storage_ptr__,float depth)

{
  vector<float,_std::allocator<float>_> local_150;
  string local_128;
  string local_108;
  ProgramSources local_e8;
  float local_14;
  ObjectData *pOStack_10;
  float depth_local;
  
  local_14 = depth;
  pOStack_10 = __return_storage_ptr__;
  Performance::(anonymous_namespace)::Utils::getInstanceNoiseVertexShader_abi_cxx11_();
  Performance::(anonymous_namespace)::Utils::getDepthAsRedFragmentShader_abi_cxx11_();
  glu::makeVtxFragSources(&local_e8,&local_108,&local_128);
  getFullscreenQuad(&local_150,local_14);
  ObjectData::ObjectData(__return_storage_ptr__,&local_e8,&local_150);
  std::vector<float,_std::allocator<float>_>::~vector(&local_150);
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

inline ObjectData variableQuad (float depth)
	{
		return ObjectData(glu::makeVtxFragSources(getInstanceNoiseVertexShader(), getDepthAsRedFragmentShader()), getFullscreenQuad(depth));
	}